

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Exec
          (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,Matcher *matcher
          ,Char *input,CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  uint uVar1;
  CharCount CVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  
  uVar1 = (this->super_BackupMixin).backup.lower;
  CVar2 = *matchStart;
  if (inputLength - CVar2 < uVar1) {
LAB_00f04d98:
    *matchStart = inputLength;
    bVar4 = true;
  }
  else {
    if (*inputOffset < *nextSyncInputOffset) {
      *instPointer = *instPointer + 0x451;
    }
    else {
      if (*inputOffset - CVar2 < uVar1) {
        *inputOffset = CVar2 + uVar1;
      }
      if ((((matcher->program).ptr)->rep).insts.litbufLen -
          (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.offset <
          (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length << 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x2ae,
                           "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                           ,
                           "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      bVar4 = TextbookBoyerMoore<char16_t>::Match<4u,1u>
                        (&(this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner,input,
                         inputLength,inputOffset,
                         (((matcher->program).ptr)->rep).insts.litbuf.ptr +
                         (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.
                         offset,(this->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                                super_LiteralMixin.length,matcher->stats);
      if (!bVar4) goto LAB_00f04d98;
      *nextSyncInputOffset = *inputOffset + 1;
      uVar1 = (this->super_BackupMixin).backup.upper;
      if (uVar1 != 0xffffffff) {
        uVar6 = *inputOffset - *matchStart;
        if (uVar1 <= uVar6) {
          uVar6 = uVar1;
        }
        *matchStart = *inputOffset - uVar6;
      }
      *inputOffset = *matchStart;
      *instPointer = *instPointer + 0x451;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool SyncToLiteralAndBackupInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if(inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;

        instPointer += sizeof(*this);
        return false;
    }